

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O0

void __thiscall
RenX_ChatLogPlugin::WriteToLog
          (RenX_ChatLogPlugin *this,Server *server,PlayerInfo *player,string_view message,
          string *in_prefix)

{
  ushort uVar1;
  ulong uVar2;
  string *psVar3;
  char *pcVar4;
  ostream *poVar5;
  unsigned_short serverPort;
  string *serverHostname;
  string *in_prefix_local;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_ChatLogPlugin *this_local;
  string_view message_local;
  
  PrepFile(this);
  uVar2 = std::fstream::is_open();
  if ((uVar2 & 1) != 0) {
    psVar3 = (string *)RenX::Server::getSocketHostname_abi_cxx11_();
    uVar1 = RenX::Server::getSocketPort();
    pcVar4 = (char *)getTimeFormat("%T");
    poVar5 = std::operator<<((ostream *)&this->field_0xd0,pcVar4);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,psVar3);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,(string *)in_prefix);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,(string *)&player->name);
    poVar5 = std::operator<<(poVar5,": ");
    poVar5 = operator<<(poVar5,message);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void RenX_ChatLogPlugin::WriteToLog(RenX::Server& server, const RenX::PlayerInfo& player, std::string_view  message, std::string in_prefix)
{
	// Check if new file needs to be opened
	PrepFile();

	if (!fs.is_open()) {
		return;
	}

	const std::string& serverHostname = server.getSocketHostname();
	unsigned short serverPort = server.getSocketPort();

	fs << getTimeFormat("%T")
		<< " "
		<< serverHostname
		<< ":"
		<< serverPort
		<< " "
		<< in_prefix
		<< " "
		<< player.name
		<< ": "
		<< message
		<< std::endl;
}